

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5714b::array::validate
          (array *this,json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  value_t vVar1;
  element_type *peVar2;
  pointer pbVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  reference pbVar7;
  reference lhs;
  pointer psVar8;
  array *paVar9;
  _Base_ptr p_Var10;
  pointer pbVar11;
  size_t array_idx;
  difference_type dVar12;
  const_iterator it;
  const_iterator result_2;
  const_iterator __begin3_2;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  result_1;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  v;
  string_t local_168;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_148;
  undefined1 local_120 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_110;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  array *local_c8;
  json_pointer *local_c0;
  error_handler *local_b8;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b0;
  json_patch *local_90;
  json *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_80;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_78;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_58;
  
  local_c8 = this;
  local_c0 = ptr;
  local_b8 = e;
  local_90 = patch;
  if (((this->maxItems_).first == true) && (vVar1 = instance->m_type, vVar1 != null)) {
    if (vVar1 == object) {
      uVar6 = (((instance->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
      uVar6 = 1;
      if (vVar1 == array) {
        uVar6 = (long)(((instance->m_value).array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(((instance->m_value).array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4;
      }
    }
    if ((this->maxItems_).second < uVar6) {
      local_120._0_8_ = (pointer)&vStack_110;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_120,"array has too many items","");
      (*local_b8->_vptr_error_handler[2])(local_b8,local_c0,instance,local_120);
      if ((pointer)local_120._0_8_ != (pointer)&vStack_110) {
        operator_delete((void *)local_120._0_8_,
                        (ulong)((long)vStack_110.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
  }
  if ((local_c8->minItems_).first == true) {
    vVar1 = instance->m_type;
    uVar6 = (ulong)vVar1;
    if (vVar1 != null) {
      if (vVar1 == object) {
        uVar6 = (((instance->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (vVar1 == array) {
        uVar6 = (long)(((instance->m_value).array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(((instance->m_value).array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4;
      }
      else {
        uVar6 = 1;
      }
    }
    if (uVar6 < (local_c8->minItems_).second) {
      local_120._0_8_ = (pointer)&vStack_110;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_120,"array has too few items","");
      (*local_b8->_vptr_error_handler[2])(local_b8,local_c0,instance,local_120);
      if ((pointer)local_120._0_8_ != (pointer)&vStack_110) {
        operator_delete((void *)local_120._0_8_,
                        (ulong)((long)vStack_110.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
  }
  if (local_c8->uniqueItems_ == true) {
    local_148.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_148.m_it.array_iterator._M_current = (pointer)0x0;
    local_148.m_it.primitive_iterator.m_it = -0x8000000000000000;
    vVar1 = instance->m_type;
    local_148.m_object = instance;
    if (vVar1 == null) {
      local_148.m_it.primitive_iterator.m_it = 1;
    }
    else if (vVar1 == array) {
      local_148.m_it.array_iterator._M_current =
           (((instance->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    }
    else if (vVar1 == object) {
      local_148.m_it.object_iterator._M_node = (_Base_ptr)((instance->m_value).binary)->m_subtype;
    }
    else {
      local_148.m_it.primitive_iterator.m_it = 0;
    }
    while( true ) {
      local_120._8_8_ = (_Base_ptr)0x0;
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8000000000000000;
      if (vVar1 == array) {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((instance->m_value).array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (vVar1 == object) {
        local_120._8_8_ = &(((instance->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
      }
      local_120._0_8_ = instance;
      bVar5 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&local_148,
                         (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_120);
      if (bVar5) break;
      local_78.m_object = local_148.m_object;
      local_78.m_it.primitive_iterator.m_it = local_148.m_it.primitive_iterator.m_it;
      local_78.m_it.object_iterator._M_node = local_148.m_it.object_iterator._M_node;
      local_78.m_it.array_iterator._M_current = local_148.m_it.array_iterator._M_current;
      dVar12 = 1;
      nlohmann::json_abi_v3_11_2::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator+=(&local_78,1);
      if (instance->m_type == array) {
        pbVar11 = (((instance->m_value).array)->
                  super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        dVar12 = -0x8000000000000000;
LAB_00126c1b:
        p_Var10 = (_Base_ptr)0x0;
      }
      else {
        if (instance->m_type != object) {
          pbVar11 = (pointer)0x0;
          goto LAB_00126c1b;
        }
        p_Var10 = &(((instance->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
        dVar12 = -0x8000000000000000;
        pbVar11 = (pointer)0x0;
      }
      pbVar7 = nlohmann::json_abi_v3_11_2::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_148);
      local_168.field_2._8_8_ = local_78.m_it.primitive_iterator.m_it;
      local_168._M_string_length = (size_type)local_78.m_it.object_iterator._M_node;
      local_168.field_2._M_allocated_capacity = (size_type)local_78.m_it.array_iterator._M_current;
      local_168._M_dataplus._M_p = (pointer)local_78.m_object;
      local_b0.m_object = instance;
      local_b0.m_it.object_iterator._M_node = p_Var10;
      local_b0.m_it.array_iterator._M_current = pbVar11;
      local_b0.m_it.primitive_iterator.m_it = dVar12;
      bVar5 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_168,&local_b0);
      while (!bVar5) {
        local_120._0_8_ = local_168._M_dataplus._M_p;
        local_120._8_8_ = local_168._M_string_length;
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168.field_2._M_allocated_capacity
        ;
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_168.field_2._8_8_;
        lhs = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_120);
        bVar5 = nlohmann::json_abi_v3_11_2::operator==(lhs,pbVar7);
        if (bVar5) break;
        if (*local_168._M_dataplus._M_p == '\x02') {
          local_168.field_2._M_allocated_capacity = local_168.field_2._M_allocated_capacity + 0x10;
        }
        else if (*local_168._M_dataplus._M_p == '\x01') {
          local_168._M_string_length =
               std::_Rb_tree_increment((_Rb_tree_node_base *)local_168._M_string_length);
        }
        else {
          local_168.field_2._8_8_ = local_168.field_2._8_8_ + 1;
        }
        bVar5 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_168,&local_b0);
      }
      local_58.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_168.field_2._M_allocated_capacity;
      local_58.m_it.primitive_iterator.m_it = local_168.field_2._8_8_;
      local_58.m_object = (pointer)local_168._M_dataplus._M_p;
      local_58.m_it.object_iterator._M_node = (_Base_ptr)local_168._M_string_length;
      local_120._8_8_ = (_Base_ptr)0x0;
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8000000000000000;
      if (instance->m_type == array) {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((instance->m_value).array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (instance->m_type == object) {
        local_120._8_8_ = &(((instance->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
      }
      local_120._0_8_ = instance;
      bVar5 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&local_58,
                         (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_120);
      if (!bVar5) {
        local_120._0_8_ = &vStack_110;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"items have to be unique for this array","");
        (*local_b8->_vptr_error_handler[2])
                  (local_b8,local_c0,instance,
                   (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_120);
        if ((json *)local_120._0_8_ != (json *)&vStack_110) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)vStack_110.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
      }
      if ((local_148.m_object)->m_type == array) {
        local_148.m_it.array_iterator._M_current = local_148.m_it.array_iterator._M_current + 1;
      }
      else if ((local_148.m_object)->m_type == object) {
        local_148.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_148.m_it.object_iterator._M_node);
      }
      else {
        local_148.m_it.primitive_iterator.m_it = local_148.m_it.primitive_iterator.m_it + 1;
      }
      vVar1 = instance->m_type;
    }
  }
  paVar9 = local_c8;
  local_168._M_dataplus._M_p = (pointer)instance;
  local_88 = instance;
  if ((local_c8->items_schema_).
      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    psVar8 = (local_c8->items_).
             super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_120._8_8_ = (_Rb_tree_node_base *)0x0;
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8000000000000000;
    vVar1 = instance->m_type;
    if (vVar1 == null) {
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
LAB_00127071:
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity = 0;
      local_168.field_2._8_8_ = 1;
    }
    else if (vVar1 == array) {
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((instance->m_value).array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_168._M_string_length = 0;
      local_168.field_2._8_8_ = 0x8000000000000000;
      local_168.field_2._M_allocated_capacity =
           (size_type)
           (((instance->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        goto LAB_00127071;
      }
      local_120._8_8_ = ((instance->m_value).binary)->m_subtype;
      local_168.field_2._M_allocated_capacity = 0;
      local_168.field_2._8_8_ = 0x8000000000000000;
      local_168._M_string_length =
           (size_type)
           &(((instance->m_value).binary)->
            super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
    }
    local_120._0_8_ = instance;
    bVar5 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_120,
                       (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_168);
    paVar9 = local_c8;
    if (!bVar5) {
      local_80 = &(local_c8->additionalItems_).
                  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
      do {
        pbVar7 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_120);
        local_148.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
        if (psVar8 == (local_c8->items_).
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          local_148.m_object =
               (pointer)(local_c8->additionalItems_).
                        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148.m_it,local_80);
        }
        else {
          local_148.m_object =
               (pointer)(psVar8->
                        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148.m_it,
                     &(psVar8->
                      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_refcount);
          psVar8 = psVar8 + 1;
        }
        pbVar3 = local_148.m_object;
        if ((element_type *)local_148.m_object == (element_type *)0x0) {
          paVar9 = local_c8;
          if (local_148.m_it.object_iterator._M_node != (_Rb_tree_node_base *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_148.m_it.object_iterator._M_node);
            paVar9 = local_c8;
          }
          break;
        }
        nlohmann::json_abi_v3_11_2::operator/
                  ((json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0,local_c0,0);
        (*(*(_func_int ***)&pbVar3->m_type)[3])(pbVar3,&local_b0,pbVar7,local_90,local_b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b0);
        if (local_148.m_it.object_iterator._M_node != (_Rb_tree_node_base *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_148.m_it.object_iterator._M_node);
        }
        if (*(value_t *)local_120._0_8_ == array) {
          vStack_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)vStack_110.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x10);
        }
        else if (*(value_t *)local_120._0_8_ == object) {
          local_120._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_120._8_8_);
        }
        else {
          vStack_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)&(((_Rep_type *)
                          &(vStack_110.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)->_M_impl).
                         field_0x1;
        }
        bVar5 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_120,
                           (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_168);
        paVar9 = local_c8;
      } while (!bVar5);
    }
  }
  else {
    local_120._8_8_ = (_Rb_tree_node_base *)0x0;
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8000000000000000;
    vVar1 = instance->m_type;
    if (vVar1 == null) {
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
LAB_00126f61:
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity = 0;
      local_168.field_2._8_8_ = 1;
    }
    else if (vVar1 == array) {
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(((instance->m_value).array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_168._M_string_length = 0;
      local_168.field_2._8_8_ = 0x8000000000000000;
      local_168.field_2._M_allocated_capacity =
           (size_type)
           (((instance->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        goto LAB_00126f61;
      }
      local_120._8_8_ = ((instance->m_value).binary)->m_subtype;
      local_168.field_2._M_allocated_capacity = 0;
      local_168.field_2._8_8_ = 0x8000000000000000;
      local_168._M_string_length =
           (size_type)
           &(((instance->m_value).binary)->
            super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
    }
    local_120._0_8_ = instance;
    bVar5 = nlohmann::json_abi_v3_11_2::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_120,
                       (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_168);
    if (!bVar5) {
      array_idx = 0;
      do {
        pbVar7 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_120);
        peVar2 = (paVar9->items_schema_).
                 super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        nlohmann::json_abi_v3_11_2::operator/
                  ((json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0,local_c0,array_idx);
        (*peVar2->_vptr_schema[3])(peVar2,&local_b0,pbVar7,local_90,local_b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b0);
        if (*(value_t *)local_120._0_8_ == array) {
          vStack_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)vStack_110.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x10);
        }
        else if (*(value_t *)local_120._0_8_ == object) {
          local_120._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_120._8_8_);
        }
        else {
          vStack_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)&(((_Rep_type *)
                          &(vStack_110.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)->_M_impl).
                         field_0x1;
        }
        bVar5 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_120,
                           (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_168);
        array_idx = array_idx + 1;
      } while (!bVar5);
    }
  }
  if ((paVar9->contains_).
      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    return;
  }
  local_b0.m_object = local_88;
  local_b0.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
  local_b0.m_it.array_iterator._M_current = (pointer)0x0;
  local_b0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = local_88->m_type;
  if (vVar1 == null) {
    local_b0.m_it.primitive_iterator.m_it = 1;
  }
  else {
    if (vVar1 == array) {
      local_b0.m_it.array_iterator._M_current =
           (((local_88->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_148.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_148.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_148.m_it.array_iterator._M_current =
           (((local_88->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_001272ae;
    }
    if (vVar1 == object) {
      local_b0.m_it.object_iterator._M_node = (_Base_ptr)((local_88->m_value).binary)->m_subtype;
      local_148.m_it.array_iterator._M_current = (pointer)0x0;
      local_148.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_148.m_it.object_iterator._M_node =
           (_Base_ptr)
           &(((local_88->m_value).binary)->
            super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
      goto LAB_001272ae;
    }
    local_b0.m_it.primitive_iterator.m_it = 0;
  }
  local_148.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_148.m_it.array_iterator._M_current = (pointer)0x0;
  local_148.m_it.primitive_iterator.m_it = 1;
LAB_001272ae:
  local_148.m_object = local_88;
  bVar5 = nlohmann::json_abi_v3_11_2::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_b0,&local_148);
  if (!bVar5) {
    do {
      pbVar7 = nlohmann::json_abi_v3_11_2::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_b0);
      local_120._0_8_ = &PTR__first_error_handler_0015a698;
      local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity =
           local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split(&vStack_110,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
      local_f8.m_type = null;
      local_f8.m_value.object = (object_t *)0x0;
      local_e0 = 0;
      local_d8 = 0;
      peVar2 = (local_c8->contains_).
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e8 = &local_d8;
      (*peVar2->_vptr_schema[3])(peVar2,local_c0,pbVar7,local_90,local_120);
      cVar4 = local_120[8];
      local_120._0_8_ = &PTR__first_error_handler_0015a698;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_110);
      if (cVar4 == '\0') {
        return;
      }
      if ((local_b0.m_object)->m_type == array) {
        local_b0.m_it.array_iterator._M_current = local_b0.m_it.array_iterator._M_current + 1;
      }
      else if ((local_b0.m_object)->m_type == object) {
        local_b0.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_b0.m_it.object_iterator._M_node);
      }
      else {
        local_b0.m_it.primitive_iterator.m_it = local_b0.m_it.primitive_iterator.m_it + 1;
      }
      bVar5 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&local_b0,&local_148);
    } while (!bVar5);
  }
  local_120._0_8_ = (pointer)&vStack_110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"array does not contain required element as per \'contains\'","");
  (*local_b8->_vptr_error_handler[2])(local_b8,local_c0,local_88,local_120);
  if ((pointer)local_120._0_8_ != (pointer)&vStack_110) {
    operator_delete((void *)local_120._0_8_,
                    (ulong)((long)vStack_110.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const override
	{
		if (maxItems_.first && instance.size() > maxItems_.second)
			e.error(ptr, instance, "array has too many items");

		if (minItems_.first && instance.size() < minItems_.second)
			e.error(ptr, instance, "array has too few items");

		if (uniqueItems_) {
			for (auto it = instance.cbegin(); it != instance.cend(); ++it) {
				auto v = std::find(it + 1, instance.end(), *it);
				if (v != instance.end())
					e.error(ptr, instance, "items have to be unique for this array");
			}
		}

		size_t index = 0;
		if (items_schema_)
			for (auto &i : instance) {
				items_schema_->validate(ptr / index, i, patch, e);
				index++;
			}
		else {
			auto item = items_.cbegin();
			for (auto &i : instance) {
				std::shared_ptr<schema> item_validator;
				if (item == items_.cend())
					item_validator = additionalItems_;
				else {
					item_validator = *item;
					item++;
				}

				if (!item_validator)
					break;

				item_validator->validate(ptr / index, i, patch, e);
			}
		}

		if (contains_) {
			bool contained = false;
			for (auto &item : instance) {
				first_error_handler local_e;
				contains_->validate(ptr, item, patch, local_e);
				if (!local_e) {
					contained = true;
					break;
				}
			}
			if (!contained)
				e.error(ptr, instance, "array does not contain required element as per 'contains'");
		}
	}